

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O2

void translate_instruction
               (vector<z80,_std::allocator<z80>_> *instructions,OpCode op,Operand *o1,Operand *o2)

{
  bool bVar1;
  string *this;
  string *this_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined1 local_1218 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1210 [4];
  undefined1 local_1178 [8];
  undefined1 local_1170 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1160;
  undefined1 local_1150 [40];
  string local_1128;
  string local_1108;
  string local_10e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10c8;
  string local_10a8;
  undefined1 local_1088 [40];
  undefined1 local_1060 [40];
  undefined1 local_1038 [40];
  undefined1 local_1010 [40];
  undefined1 local_fe8 [40];
  Operand local_fc0;
  undefined1 local_f98 [40];
  undefined1 local_f70 [40];
  undefined1 local_f48 [40];
  undefined1 local_f20 [40];
  undefined1 local_ef8 [40];
  undefined1 local_ed0 [40];
  undefined1 local_ea8 [40];
  undefined1 local_e80 [40];
  undefined1 local_e58 [40];
  undefined1 local_e30 [40];
  undefined1 local_e08 [40];
  undefined1 local_de0 [40];
  undefined1 local_db8 [40];
  undefined1 local_d90 [40];
  undefined1 local_d68 [40];
  undefined1 local_d40 [40];
  Operand local_d18;
  undefined1 local_cf0 [40];
  undefined1 local_cc8 [40];
  undefined1 local_ca0 [40];
  undefined1 local_c78 [40];
  undefined1 local_c50 [40];
  undefined1 local_c28 [40];
  undefined1 local_c00 [40];
  undefined1 local_bd8 [40];
  undefined1 local_bb0 [40];
  Operand local_b88;
  undefined1 local_b60 [40];
  undefined1 local_b38 [40];
  undefined1 local_b10 [40];
  undefined1 local_ae8 [40];
  undefined1 local_ac0 [40];
  undefined1 local_a98 [40];
  undefined1 local_a70 [40];
  undefined1 local_a48 [40];
  undefined1 local_a20 [40];
  undefined1 local_9f8 [40];
  undefined1 local_9d0 [40];
  undefined1 local_9a8 [40];
  undefined1 local_980 [40];
  undefined1 local_958 [40];
  undefined1 local_930 [40];
  Operand local_908;
  undefined1 local_8e0 [40];
  undefined1 local_8b8 [40];
  undefined1 local_890 [40];
  undefined1 local_868 [40];
  undefined1 local_840 [40];
  undefined1 local_818 [40];
  undefined1 local_7f0 [40];
  undefined1 local_7c8 [40];
  undefined1 local_7a0 [40];
  undefined1 local_778 [8];
  _Alloc_hider _Stack_770;
  size_type local_768;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_760;
  undefined1 local_748 [8];
  _Alloc_hider _Stack_740;
  size_type local_738;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_730;
  undefined1 local_718 [8];
  _Alloc_hider _Stack_710;
  size_type local_708;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_700;
  undefined1 local_6e8 [8];
  _Alloc_hider _Stack_6e0;
  size_type local_6d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_6d0;
  undefined1 local_6b8 [8];
  _Alloc_hider _Stack_6b0;
  size_type local_6a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_6a0;
  undefined1 local_688 [8];
  _Alloc_hider _Stack_680;
  size_type local_678;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_670;
  undefined1 local_658 [8];
  _Alloc_hider _Stack_650;
  size_type local_648;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_640;
  undefined1 local_628 [8];
  _Alloc_hider _Stack_620;
  size_type local_618;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_610;
  undefined1 local_5f8 [8];
  _Alloc_hider _Stack_5f0;
  size_type local_5e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_5e0;
  undefined1 local_5c8 [8];
  _Alloc_hider _Stack_5c0;
  size_type local_5b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_5b0;
  undefined1 local_598 [8];
  _Alloc_hider _Stack_590;
  size_type local_588;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_580;
  undefined1 local_568 [8];
  _Alloc_hider _Stack_560;
  size_type local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_550;
  undefined1 local_538 [8];
  _Alloc_hider _Stack_530;
  size_type local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_520;
  undefined1 local_508 [8];
  _Alloc_hider _Stack_500;
  size_type local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4f0;
  Operand local_4e0;
  undefined1 local_4b8 [40];
  Operand local_490;
  Operand local_468;
  Operand local_440;
  Operand local_418;
  Operand local_3f0;
  undefined1 local_3c8 [40];
  undefined1 local_3a0 [40];
  Operand local_378;
  undefined1 local_350 [40];
  Operand local_328;
  undefined1 local_300 [40];
  Operand local_2d8;
  undefined1 local_2b0 [40];
  Operand local_288;
  undefined1 local_260 [40];
  Operand local_238;
  undefined1 local_210 [40];
  Operand local_1e8;
  undefined1 local_1c0 [40];
  undefined1 local_198 [40];
  undefined1 local_170 [40];
  undefined1 local_148 [40];
  Operand local_120;
  undefined1 local_f8 [40];
  undefined1 local_d0 [40];
  undefined1 local_a8 [40];
  undefined1 local_80 [40];
  undefined1 local_58 [40];
  
  switch(op) {
  case hlt:
    local_1218._0_4_ = 1;
    goto LAB_001142af;
  default:
    local_1218 = (undefined1  [8])((ulong)(uint)local_1218._4_4_ << 0x20);
    goto LAB_001142af;
  case movzwl:
    local_1178._0_4_ = 4;
    Operand::Operand(&local_468,o1);
    translateLiteral((Operand *)local_1218,&local_468);
    std::vector<z80,std::allocator<z80>>::emplace_back<z80::OpCode,Operand&,Operand>
              ((vector<z80,std::allocator<z80>> *)instructions,(OpCode *)local_1178,&registers.iy,
               (Operand *)local_1218);
    std::__cxx11::string::~string((string *)(local_1218 + 8));
    this_00 = &local_468.value;
    break;
  case xorl:
    Operand::Operand((Operand *)local_3a0,o2);
    translateRegister((Operand *)local_1218,(Operand *)local_3a0);
    bVar1 = Operand::operator!=((Operand *)local_1218,&registers.a);
    std::__cxx11::string::~string((string *)(local_1218 + 8));
    std::__cxx11::string::~string((string *)(local_3a0 + 8));
    if (bVar1) {
      Operand::Operand((Operand *)local_3c8,o2);
      translateRegister((Operand *)local_1218,(Operand *)local_3c8);
      Operand::Operand((Operand *)local_de0,o1);
      translateRegister((Operand *)local_1178,(Operand *)local_de0);
      bVar1 = Operand::operator==((Operand *)local_1218,(Operand *)local_1178);
      std::__cxx11::string::~string((string *)local_1170);
      std::__cxx11::string::~string((string *)(local_de0 + 8));
      std::__cxx11::string::~string((string *)(local_1218 + 8));
      std::__cxx11::string::~string((string *)(local_3c8 + 8));
      if (bVar1) {
        Operand::Operand(&local_3f0,o1);
        translateRegister((Operand *)local_e08,&local_3f0);
        literal((Operand *)local_e30,0);
        z80::z80((z80 *)local_1218,ld,(Operand *)local_e08,(Operand *)local_e30);
        std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
        z80::~z80((z80 *)local_1218);
        std::__cxx11::string::~string((string *)(local_e30 + 8));
        std::__cxx11::string::~string((string *)(local_e08 + 8));
        this_00 = &local_3f0.value;
      }
      else {
        Operand::Operand(&local_418,o2);
        translateRegister((Operand *)local_1218,&local_418);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1178,"Attempt to xor a register other than a!",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_1218 + 8));
        log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        std::__cxx11::string::~string((string *)local_1178);
        std::__cxx11::string::~string((string *)(local_1218 + 8));
        this_00 = &local_418.value;
      }
    }
    else {
      Operand::Operand(&local_440,o2);
      translateValue((Operand *)local_e58,&local_440);
      Operand::Operand((Operand *)local_ea8,o1);
      translateValue((Operand *)local_e80,(Operand *)local_ea8);
      z80::z80((z80 *)local_1218,_xor,(Operand *)local_e58,(Operand *)local_e80);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
      z80::~z80((z80 *)local_1218);
      std::__cxx11::string::~string((string *)(local_e80 + 8));
      std::__cxx11::string::~string((string *)(local_ea8 + 8));
      std::__cxx11::string::~string((string *)(local_e58 + 8));
      this_00 = &local_440.value;
    }
    break;
  case ret:
  case retl:
    local_1218._0_4_ = 2;
LAB_001142af:
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80::OpCode>
              (instructions,(OpCode *)local_1218);
    return;
  case movb:
  case movl:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_10e8,"(%esp)",(allocator<char> *)local_1178);
    literal((Operand *)local_1218,&local_10e8);
    bVar1 = Operand::operator==(o2,(Operand *)local_1218);
    std::__cxx11::string::~string((string *)(local_1218 + 8));
    std::__cxx11::string::~string((string *)&local_10e8);
    if (bVar1) {
      local_1178._0_4_ = 4;
      Operand::Operand((Operand *)local_4b8,o1);
      translateValue((Operand *)local_1218,(Operand *)local_4b8);
      std::vector<z80,std::allocator<z80>>::emplace_back<z80::OpCode,Operand&,Operand>
                ((vector<z80,std::allocator<z80>> *)instructions,(OpCode *)local_1178,&registers.iyl
                 ,(Operand *)local_1218);
      std::__cxx11::string::~string((string *)(local_1218 + 8));
      std::__cxx11::string::~string((string *)(local_4b8 + 8));
      local_1178._0_4_ = 4;
      literal((Operand *)local_1218,0);
      std::vector<z80,std::allocator<z80>>::emplace_back<z80::OpCode,Operand&,Operand>
                ((vector<z80,std::allocator<z80>> *)instructions,(OpCode *)local_1178,&registers.iyh
                 ,(Operand *)local_1218);
      std::__cxx11::string::~string((string *)(local_1218 + 8));
      local_1178._0_4_ = 7;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1108,"(sp)",(allocator<char> *)local_1150);
      literal((Operand *)local_1218,&local_1108);
      std::vector<z80,std::allocator<z80>>::emplace_back<z80::OpCode,Operand,Operand&>
                ((vector<z80,std::allocator<z80>> *)instructions,(OpCode *)local_1178,
                 (Operand *)local_1218,&registers.iy);
      std::__cxx11::string::~string((string *)(local_1218 + 8));
      this_00 = &local_1108;
    }
    else {
      local_1218._0_4_ = reg;
      local_1218._4_4_ = 0x10;
      local_1210[0]._M_string_length = 0;
      local_1210[0].field_2._M_local_buf[0] = '\0';
      local_1210[0]._M_dataplus._M_p = local_1218 + 0x18;
      bVar1 = Operand::operator!=(o1,(Operand *)local_1218);
      std::__cxx11::string::~string((string *)(local_1218 + 8));
      if (bVar1) {
        Operand::Operand((Operand *)local_ef8,&registers.a);
        Operand::Operand((Operand *)local_f48,o1);
        translateLiteral((Operand *)local_f20,(Operand *)local_f48);
        z80::z80((z80 *)local_1218,ld,(Operand *)local_ef8,(Operand *)local_f20);
        std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
        z80::~z80((z80 *)local_1218);
        std::__cxx11::string::~string((string *)(local_f20 + 8));
        std::__cxx11::string::~string((string *)(local_f48 + 8));
        std::__cxx11::string::~string((string *)(local_ef8 + 8));
      }
      local_1218._0_4_ = reg;
      local_1218._4_4_ = 0x10;
      local_1210[0]._M_string_length = 0;
      local_1210[0].field_2._M_local_buf[0] = '\0';
      local_1210[0]._M_dataplus._M_p = local_1218 + 0x18;
      bVar1 = Operand::operator!=(o2,(Operand *)local_1218);
      std::__cxx11::string::~string((string *)(local_1218 + 8));
      if (!bVar1) {
        return;
      }
      Operand::Operand(&local_4e0,o2);
      translateAddress((Operand *)local_f70,&local_4e0);
      Operand::Operand((Operand *)local_f98,&registers.a);
      z80::z80((z80 *)local_1218,ld,(Operand *)local_f70,(Operand *)local_f98);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
      z80::~z80((z80 *)local_1218);
      std::__cxx11::string::~string((string *)(local_f98 + 8));
      std::__cxx11::string::~string((string *)(local_f70 + 8));
      this_00 = &local_4e0.value;
    }
    break;
  case movw:
    local_1150._0_4_ = 4;
    Operand::Operand(&local_490,o2);
    translateAddress((Operand *)local_1218,&local_490);
    Operand::Operand((Operand *)local_ed0,o1);
    translateValue((Operand *)local_1178,(Operand *)local_ed0);
    std::vector<z80,std::allocator<z80>>::emplace_back<z80::OpCode,Operand,Operand>
              ((vector<z80,std::allocator<z80>> *)instructions,(OpCode *)local_1150,
               (Operand *)local_1218,(Operand *)local_1178);
    std::__cxx11::string::~string((string *)local_1170);
    std::__cxx11::string::~string((string *)(local_ed0 + 8));
    std::__cxx11::string::~string((string *)(local_1218 + 8));
    this_00 = &local_490.value;
    break;
  case jne:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_10a8,"nz",(allocator<char> *)local_1178);
    literal((Operand *)local_a48,&local_10a8);
    Operand::Operand((Operand *)local_a98,o1);
    translateLiteral((Operand *)local_a70,(Operand *)local_a98);
    z80::z80((z80 *)local_1218,jp,(Operand *)local_a48,(Operand *)local_a70);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
    z80::~z80((z80 *)local_1218);
    std::__cxx11::string::~string((string *)(local_a70 + 8));
    std::__cxx11::string::~string((string *)(local_a98 + 8));
    std::__cxx11::string::~string((string *)(local_a48 + 8));
    this_00 = &local_10a8;
    break;
  case incl:
    Operand::Operand((Operand *)local_2b0,o1);
    translateValue((Operand *)local_a20,(Operand *)local_2b0);
    _Stack_740._M_p = (pointer)&aStack_730;
    aStack_730._8_8_ = 0;
    local_748._0_4_ = empty;
    local_748._4_4_ = 0;
    local_738 = 0;
    aStack_730._M_allocated_capacity = 0;
    z80::z80((z80 *)local_1218,inc,(Operand *)local_a20,(Operand *)local_748);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
    z80::~z80((z80 *)local_1218);
    std::__cxx11::string::~string((string *)&_Stack_740);
    std::__cxx11::string::~string((string *)(local_a20 + 8));
    std::__cxx11::string::~string((string *)(local_2b0 + 8));
    literal(&local_2d8,0);
    _Stack_770._M_p = (pointer)&aStack_760;
    aStack_760._8_8_ = 0;
    local_778._0_4_ = empty;
    local_778._4_4_ = 0;
    local_768 = 0;
    aStack_760._M_allocated_capacity = 0;
    z80::z80((z80 *)local_1218,cp,&local_2d8,(Operand *)local_778);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
    z80::~z80((z80 *)local_1218);
    std::__cxx11::string::~string((string *)&_Stack_770);
    this_00 = &local_2d8.value;
    break;
  case decl:
    Operand::Operand((Operand *)local_260,o1);
    translateValue((Operand *)local_9f8,(Operand *)local_260);
    _Stack_6e0._M_p = (pointer)&aStack_6d0;
    aStack_6d0._8_8_ = 0;
    local_6e8._0_4_ = empty;
    local_6e8._4_4_ = 0;
    local_6d8 = 0;
    aStack_6d0._M_allocated_capacity = 0;
    z80::z80((z80 *)local_1218,dec,(Operand *)local_9f8,(Operand *)local_6e8);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
    z80::~z80((z80 *)local_1218);
    std::__cxx11::string::~string((string *)&_Stack_6e0);
    std::__cxx11::string::~string((string *)(local_9f8 + 8));
    std::__cxx11::string::~string((string *)(local_260 + 8));
    literal(&local_288,0);
    _Stack_710._M_p = (pointer)&aStack_700;
    aStack_700._8_8_ = 0;
    local_718._0_4_ = empty;
    local_718._4_4_ = 0;
    local_708 = 0;
    aStack_700._M_allocated_capacity = 0;
    z80::z80((z80 *)local_1218,cp,&local_288,(Operand *)local_718);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
    z80::~z80((z80 *)local_1218);
    std::__cxx11::string::~string((string *)&_Stack_710);
    this_00 = &local_288.value;
    break;
  case addl:
    Operand::Operand((Operand *)local_350,o2);
    translateValue((Operand *)local_1218,(Operand *)local_350);
    bVar1 = Operand::operator==((Operand *)local_1218,&registers.sp);
    std::__cxx11::string::~string((string *)(local_1218 + 8));
    std::__cxx11::string::~string((string *)(local_350 + 8));
    if (bVar1) {
      Operand::Operand((Operand *)local_c50,&registers.ix);
      Operand::Operand((Operand *)local_ca0,o1);
      translateLiteral((Operand *)local_1178,(Operand *)local_ca0);
      local_1128._M_dataplus._M_p = (pointer)&local_1128.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1170._0_8_ == &local_1160) {
        local_1128.field_2._8_8_ = local_1160._8_8_;
      }
      else {
        local_1128._M_dataplus._M_p = (pointer)local_1170._0_8_;
      }
      local_1128._M_string_length = local_1170._8_8_;
      local_1170._8_8_ = 0;
      local_1160._M_local_buf[0] = '\0';
      local_1170._0_8_ = &local_1160;
      literal((Operand *)local_c78,&local_1128);
      z80::z80((z80 *)local_1218,ld,(Operand *)local_c50,(Operand *)local_c78);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
      z80::~z80((z80 *)local_1218);
      std::__cxx11::string::~string((string *)(local_c78 + 8));
      std::__cxx11::string::~string((string *)&local_1128);
      std::__cxx11::string::~string((string *)local_1170);
      std::__cxx11::string::~string((string *)(local_ca0 + 8));
      std::__cxx11::string::~string((string *)(local_c50 + 8));
      Operand::Operand((Operand *)local_cc8,&registers.ix);
      Operand::Operand((Operand *)local_cf0,&registers.sp);
      z80::z80((z80 *)local_1218,add,(Operand *)local_cc8,(Operand *)local_cf0);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
      z80::~z80((z80 *)local_1218);
      std::__cxx11::string::~string((string *)(local_cf0 + 8));
      std::__cxx11::string::~string((string *)(local_cc8 + 8));
      Operand::Operand(&local_d18,&registers.sp);
      Operand::Operand((Operand *)local_d40,&registers.ix);
      z80::z80((z80 *)local_1218,ld,&local_d18,(Operand *)local_d40);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
      z80::~z80((z80 *)local_1218);
      std::__cxx11::string::~string((string *)(local_d40 + 8));
      this_00 = &local_d18.value;
    }
    else {
      Operand::Operand(&local_378,o2);
      translateValue((Operand *)local_d68,&local_378);
      Operand::Operand((Operand *)local_db8,o1);
      translateLiteral((Operand *)local_d90,(Operand *)local_db8);
      z80::z80((z80 *)local_1218,add,(Operand *)local_d68,(Operand *)local_d90);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
      z80::~z80((z80 *)local_1218);
      std::__cxx11::string::~string((string *)(local_d90 + 8));
      std::__cxx11::string::~string((string *)(local_db8 + 8));
      std::__cxx11::string::~string((string *)(local_d68 + 8));
      this_00 = &local_378.value;
    }
    break;
  case subl:
    Operand::Operand((Operand *)local_300,o2);
    translateValue((Operand *)local_1218,(Operand *)local_300);
    bVar1 = Operand::operator==((Operand *)local_1218,&registers.sp);
    std::__cxx11::string::~string((string *)(local_1218 + 8));
    std::__cxx11::string::~string((string *)(local_300 + 8));
    if (bVar1) {
      Operand::Operand((Operand *)local_ac0,&registers.ix);
      Operand::Operand((Operand *)local_b10,o1);
      translateLiteral((Operand *)local_1178,(Operand *)local_b10);
      std::operator+(&local_10c8,"-",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1170
                    );
      literal((Operand *)local_ae8,&local_10c8);
      z80::z80((z80 *)local_1218,ld,(Operand *)local_ac0,(Operand *)local_ae8);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
      z80::~z80((z80 *)local_1218);
      std::__cxx11::string::~string((string *)(local_ae8 + 8));
      std::__cxx11::string::~string((string *)&local_10c8);
      std::__cxx11::string::~string((string *)local_1170);
      std::__cxx11::string::~string((string *)(local_b10 + 8));
      std::__cxx11::string::~string((string *)(local_ac0 + 8));
      Operand::Operand((Operand *)local_b38,&registers.ix);
      Operand::Operand((Operand *)local_b60,&registers.sp);
      z80::z80((z80 *)local_1218,add,(Operand *)local_b38,(Operand *)local_b60);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
      z80::~z80((z80 *)local_1218);
      std::__cxx11::string::~string((string *)(local_b60 + 8));
      std::__cxx11::string::~string((string *)(local_b38 + 8));
      Operand::Operand(&local_b88,&registers.sp);
      Operand::Operand((Operand *)local_bb0,&registers.ix);
      z80::z80((z80 *)local_1218,ld,&local_b88,(Operand *)local_bb0);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
      z80::~z80((z80 *)local_1218);
      std::__cxx11::string::~string((string *)(local_bb0 + 8));
      this_00 = &local_b88.value;
    }
    else {
      Operand::Operand(&local_328,o2);
      translateValue((Operand *)local_bd8,&local_328);
      Operand::Operand((Operand *)local_c28,o1);
      translateLiteral((Operand *)local_c00,(Operand *)local_c28);
      z80::z80((z80 *)local_1218,sub,(Operand *)local_bd8,(Operand *)local_c00);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
      z80::~z80((z80 *)local_1218);
      std::__cxx11::string::~string((string *)(local_c00 + 8));
      std::__cxx11::string::~string((string *)(local_c28 + 8));
      std::__cxx11::string::~string((string *)(local_bd8 + 8));
      this_00 = &local_328.value;
    }
    break;
  case pushl:
    Operand::Operand((Operand *)local_58,o1);
    translateValue((Operand *)local_1218,(Operand *)local_58);
    bVar1 = Operand::operator==((Operand *)local_1218,&registers.a);
    std::__cxx11::string::~string((string *)(local_1218 + 8));
    std::__cxx11::string::~string((string *)(local_58 + 8));
    if (bVar1) {
      Operand::Operand((Operand *)local_7a0,&registers.iyh);
      Operand::Operand((Operand *)local_7c8,&registers.a);
      z80::z80((z80 *)local_1218,ld,(Operand *)local_7a0,(Operand *)local_7c8);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
      z80::~z80((z80 *)local_1218);
      std::__cxx11::string::~string((string *)(local_7c8 + 8));
      std::__cxx11::string::~string((string *)(local_7a0 + 8));
      Operand::Operand((Operand *)local_7f0,&registers.iyl);
      literal((Operand *)local_818,0);
      z80::z80((z80 *)local_1218,ld,(Operand *)local_7f0,(Operand *)local_818);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
      z80::~z80((z80 *)local_1218);
      std::__cxx11::string::~string((string *)(local_818 + 8));
      std::__cxx11::string::~string((string *)(local_7f0 + 8));
      Operand::Operand((Operand *)local_80,&registers.iy);
      _Stack_500._M_p = (pointer)&aStack_4f0;
      aStack_4f0._8_8_ = 0;
      local_508._0_4_ = empty;
      local_508._4_4_ = 0;
      local_4f8 = 0;
      aStack_4f0._M_allocated_capacity = 0;
      z80::z80((z80 *)local_1218,push,(Operand *)local_80,(Operand *)local_508);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
      z80::~z80((z80 *)local_1218);
      std::__cxx11::string::~string((string *)&_Stack_500);
      this = (string *)(local_80 + 8);
    }
    else {
      Operand::Operand((Operand *)local_1010,o1);
      translateValue((Operand *)local_1218,(Operand *)local_1010);
      bVar1 = Operand::operator==((Operand *)local_1218,&registers.de);
      if (bVar1) {
LAB_00114aff:
        std::__cxx11::string::~string((string *)(local_1218 + 8));
        std::__cxx11::string::~string((string *)(local_1010 + 8));
      }
      else {
        Operand::Operand((Operand *)local_1038,o1);
        translateValue((Operand *)local_1178,(Operand *)local_1038);
        bVar1 = Operand::operator==((Operand *)local_1178,&registers.bc);
        if (bVar1) {
          std::__cxx11::string::~string((string *)local_1170);
          std::__cxx11::string::~string((string *)(local_1038 + 8));
          goto LAB_00114aff;
        }
        Operand::Operand((Operand *)local_840,o1);
        translateValue((Operand *)local_1150,(Operand *)local_840);
        bVar1 = Operand::operator==((Operand *)local_1150,&registers.hl);
        std::__cxx11::string::~string((string *)(local_1150 + 8));
        std::__cxx11::string::~string((string *)(local_840 + 8));
        std::__cxx11::string::~string((string *)local_1170);
        std::__cxx11::string::~string((string *)(local_1038 + 8));
        std::__cxx11::string::~string((string *)(local_1218 + 8));
        std::__cxx11::string::~string((string *)(local_1010 + 8));
        if (!bVar1) {
          Operand::Operand((Operand *)local_890,&registers.iy);
          Operand::Operand((Operand *)local_8e0,o1);
          translateValue((Operand *)local_8b8,(Operand *)local_8e0);
          z80::z80((z80 *)local_1218,ld,(Operand *)local_890,(Operand *)local_8b8);
          std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
          z80::~z80((z80 *)local_1218);
          std::__cxx11::string::~string((string *)(local_8b8 + 8));
          std::__cxx11::string::~string((string *)(local_8e0 + 8));
          std::__cxx11::string::~string((string *)(local_890 + 8));
          Operand::Operand((Operand *)local_d0,&registers.iy);
          _Stack_560._M_p = (pointer)&aStack_550;
          aStack_550._8_8_ = 0;
          local_568._0_4_ = empty;
          local_568._4_4_ = 0;
          local_558 = 0;
          aStack_550._M_allocated_capacity = 0;
          z80::z80((z80 *)local_1218,push,(Operand *)local_d0,(Operand *)local_568);
          std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
          z80::~z80((z80 *)local_1218);
          std::__cxx11::string::~string((string *)&_Stack_560);
          this = (string *)(local_d0 + 8);
          goto LAB_00114bab;
        }
      }
      Operand::Operand((Operand *)local_a8,o1);
      translateValue((Operand *)local_868,(Operand *)local_a8);
      _Stack_530._M_p = (pointer)&aStack_520;
      aStack_520._8_8_ = 0;
      local_538._0_4_ = empty;
      local_538._4_4_ = 0;
      local_528 = 0;
      aStack_520._M_allocated_capacity = 0;
      z80::z80((z80 *)local_1218,push,(Operand *)local_868,(Operand *)local_538);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
      z80::~z80((z80 *)local_1218);
      std::__cxx11::string::~string((string *)&_Stack_530);
      std::__cxx11::string::~string((string *)(local_868 + 8));
      this = (string *)(local_a8 + 8);
    }
LAB_00114bab:
    std::__cxx11::string::~string(this);
    Operand::Operand((Operand *)local_f8,&registers.sp);
    _Stack_590._M_p = (pointer)&aStack_580;
    aStack_580._8_8_ = 0;
    local_598._0_4_ = empty;
    local_598._4_4_ = 0;
    local_588 = 0;
    aStack_580._M_allocated_capacity = 0;
    z80::z80((z80 *)local_1218,inc,(Operand *)local_f8,(Operand *)local_598);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
    z80::~z80((z80 *)local_1218);
    std::__cxx11::string::~string((string *)&_Stack_590);
    std::__cxx11::string::~string((string *)(local_f8 + 8));
    Operand::Operand(&local_120,&registers.ix);
    _Stack_5c0._M_p = (pointer)&aStack_5b0;
    aStack_5b0._8_8_ = 0;
    local_5c8._0_4_ = empty;
    local_5c8._4_4_ = 0;
    local_5b8 = 0;
    aStack_5b0._M_allocated_capacity = 0;
    z80::z80((z80 *)local_1218,dec,&local_120,(Operand *)local_5c8);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
    z80::~z80((z80 *)local_1218);
    std::__cxx11::string::~string((string *)&_Stack_5c0);
    this_00 = &local_120.value;
    break;
  case popl:
    Operand::Operand((Operand *)local_148,&registers.sp);
    _Stack_5f0._M_p = (pointer)&aStack_5e0;
    aStack_5e0._8_8_ = 0;
    local_5f8._0_4_ = empty;
    local_5f8._4_4_ = 0;
    local_5e8 = 0;
    aStack_5e0._M_allocated_capacity = 0;
    z80::z80((z80 *)local_1218,dec,(Operand *)local_148,(Operand *)local_5f8);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
    z80::~z80((z80 *)local_1218);
    std::__cxx11::string::~string((string *)&_Stack_5f0);
    std::__cxx11::string::~string((string *)(local_148 + 8));
    Operand::Operand((Operand *)local_170,&registers.ix);
    _Stack_620._M_p = (pointer)&aStack_610;
    aStack_610._8_8_ = 0;
    local_628._0_4_ = empty;
    local_628._4_4_ = 0;
    local_618 = 0;
    aStack_610._M_allocated_capacity = 0;
    z80::z80((z80 *)local_1218,inc,(Operand *)local_170,(Operand *)local_628);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
    z80::~z80((z80 *)local_1218);
    std::__cxx11::string::~string((string *)&_Stack_620);
    std::__cxx11::string::~string((string *)(local_170 + 8));
    Operand::Operand((Operand *)local_198,o1);
    translateValue((Operand *)local_1218,(Operand *)local_198);
    bVar1 = Operand::operator==((Operand *)local_1218,&registers.a);
    std::__cxx11::string::~string((string *)(local_1218 + 8));
    std::__cxx11::string::~string((string *)(local_198 + 8));
    if (bVar1) {
      Operand::Operand((Operand *)local_1c0,&registers.iy);
      _Stack_650._M_p = (pointer)&aStack_640;
      aStack_640._8_8_ = 0;
      local_658._0_4_ = empty;
      local_658._4_4_ = 0;
      local_648 = 0;
      aStack_640._M_allocated_capacity = 0;
      z80::z80((z80 *)local_1218,pop,(Operand *)local_1c0,(Operand *)local_658);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
      z80::~z80((z80 *)local_1218);
      std::__cxx11::string::~string((string *)&_Stack_650);
      std::__cxx11::string::~string((string *)(local_1c0 + 8));
      Operand::Operand(&local_908,&registers.a);
      Operand::Operand((Operand *)local_930,&registers.iyh);
      z80::z80((z80 *)local_1218,ld,&local_908,(Operand *)local_930);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
      z80::~z80((z80 *)local_1218);
      std::__cxx11::string::~string((string *)(local_930 + 8));
      this_00 = &local_908.value;
      break;
    }
    Operand::Operand((Operand *)local_1060,o1);
    translateValue((Operand *)local_1218,(Operand *)local_1060);
    bVar1 = Operand::operator==((Operand *)local_1218,&registers.de);
    if (bVar1) {
LAB_00114d34:
      std::__cxx11::string::~string((string *)(local_1218 + 8));
      std::__cxx11::string::~string((string *)(local_1060 + 8));
    }
    else {
      Operand::Operand((Operand *)local_1088,o1);
      translateValue((Operand *)local_1178,(Operand *)local_1088);
      bVar1 = Operand::operator==((Operand *)local_1178,&registers.bc);
      if (bVar1) {
        std::__cxx11::string::~string((string *)local_1170);
        std::__cxx11::string::~string((string *)(local_1088 + 8));
        goto LAB_00114d34;
      }
      Operand::Operand((Operand *)local_958,o1);
      translateValue((Operand *)local_1150,(Operand *)local_958);
      bVar1 = Operand::operator==((Operand *)local_1150,&registers.hl);
      std::__cxx11::string::~string((string *)(local_1150 + 8));
      std::__cxx11::string::~string((string *)(local_958 + 8));
      std::__cxx11::string::~string((string *)local_1170);
      std::__cxx11::string::~string((string *)(local_1088 + 8));
      std::__cxx11::string::~string((string *)(local_1218 + 8));
      std::__cxx11::string::~string((string *)(local_1060 + 8));
      if (!bVar1) {
        Operand::Operand((Operand *)local_210,&registers.iy);
        _Stack_6b0._M_p = (pointer)&aStack_6a0;
        aStack_6a0._8_8_ = 0;
        local_6b8._0_4_ = empty;
        local_6b8._4_4_ = 0;
        local_6a8 = 0;
        aStack_6a0._M_allocated_capacity = 0;
        z80::z80((z80 *)local_1218,pop,(Operand *)local_210,(Operand *)local_6b8);
        std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
        z80::~z80((z80 *)local_1218);
        std::__cxx11::string::~string((string *)&_Stack_6b0);
        std::__cxx11::string::~string((string *)(local_210 + 8));
        Operand::Operand(&local_238,o1);
        translateValue((Operand *)local_9a8,&local_238);
        Operand::Operand((Operand *)local_9d0,&registers.iy);
        z80::z80((z80 *)local_1218,ld,(Operand *)local_9a8,(Operand *)local_9d0);
        std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
        z80::~z80((z80 *)local_1218);
        std::__cxx11::string::~string((string *)(local_9d0 + 8));
        std::__cxx11::string::~string((string *)(local_9a8 + 8));
        this_00 = &local_238.value;
        break;
      }
    }
    Operand::Operand(&local_1e8,o1);
    translateValue((Operand *)local_980,&local_1e8);
    _Stack_680._M_p = (pointer)&aStack_670;
    aStack_670._8_8_ = 0;
    local_688._0_4_ = empty;
    local_688._4_4_ = 0;
    local_678 = 0;
    aStack_670._M_allocated_capacity = 0;
    z80::z80((z80 *)local_1218,pop,(Operand *)local_980,(Operand *)local_688);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
    z80::~z80((z80 *)local_1218);
    std::__cxx11::string::~string((string *)&_Stack_680);
    std::__cxx11::string::~string((string *)(local_980 + 8));
    this_00 = &local_1e8.value;
    break;
  case calll:
  case callw:
    Operand::Operand(&local_fc0,o1);
    Operand::Operand((Operand *)local_fe8,o2);
    z80::z80((z80 *)local_1218,call,&local_fc0,(Operand *)local_fe8);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,(z80 *)local_1218);
    z80::~z80((z80 *)local_1218);
    std::__cxx11::string::~string((string *)(local_fe8 + 8));
    this_00 = &local_fc0.value;
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void translate_instruction(std::vector<z80>& instructions, const i386::OpCode op, const Operand o1, const Operand o2) {
	switch (op) {
		case i386::OpCode::pushl:
			if (translateValue(o1) == registers.a) {
				instructions.emplace_back(z80(z80::OpCode::ld, registers.iyh, registers.a));
				instructions.emplace_back(z80(z80::OpCode::ld, registers.iyl, literal(0)));
				instructions.emplace_back(z80(z80::OpCode::push, registers.iy, Operand()));
			}
			else if(translateValue(o1) == registers.de || translateValue(o1) == registers.bc || translateValue(o1) == registers.hl) {
				instructions.emplace_back(z80(z80::OpCode::push, translateValue(o1), Operand()));
			}
			else {
				instructions.emplace_back(z80(z80::OpCode::ld, registers.iy, translateValue(o1)));
				instructions.emplace_back(z80(z80::OpCode::push, registers.iy, Operand()));
			}
			instructions.emplace_back(z80(z80::OpCode::inc, registers.sp, Operand()));
			instructions.emplace_back(z80(z80::OpCode::dec, registers.ix, Operand()));
			break;
		case i386::OpCode::popl:
			instructions.emplace_back(z80(z80::OpCode::dec, registers.sp, Operand()));
			instructions.emplace_back(z80(z80::OpCode::inc, registers.ix, Operand()));
			if (translateValue(o1) == registers.a) {
				instructions.emplace_back(z80(z80::OpCode::pop, registers.iy, Operand()));
				instructions.emplace_back(z80(z80::OpCode::ld, registers.a, registers.iyh));
			}
			else if(translateValue(o1) == registers.de || translateValue(o1) == registers.bc || translateValue(o1) == registers.hl) {
				instructions.emplace_back(z80(z80::OpCode::pop, translateValue(o1), Operand()));
			}
			else {
				instructions.emplace_back(z80(z80::OpCode::pop, registers.iy, Operand()));
				instructions.emplace_back(z80(z80::OpCode::ld, translateValue(o1),registers.iy));
			}
			break;
		case i386::OpCode::decl:
			instructions.emplace_back(z80(z80::OpCode::dec, translateValue(o1), Operand()));
			instructions.emplace_back(z80(z80::OpCode::cp, literal(0), Operand()));
			break;
		case i386::OpCode::incl:
			instructions.emplace_back(z80(z80::OpCode::inc, translateValue(o1), Operand()));
			instructions.emplace_back(z80(z80::OpCode::cp, literal(0), Operand()));
			break;
		case i386::OpCode::jne:
			instructions.emplace_back(z80(z80::OpCode::jp, literal("nz"), translateLiteral(o1)));
			break;
		case i386::OpCode::subl:
			if (translateValue(o2) == registers.sp) {
				instructions.emplace_back(z80(z80::OpCode::ld, registers.ix, literal("-" + translateLiteral(o1).value)));
				instructions.emplace_back(z80(z80::OpCode::add, registers.ix, registers.sp));
				instructions.emplace_back(z80(z80::OpCode::ld, registers.sp, registers.ix));
			}
			else {
				instructions.emplace_back(z80(z80::OpCode::sub, translateValue(o2), translateLiteral(o1)));
			}
			break;
		case i386::OpCode::addl:
			if (translateValue(o2) == registers.sp) {
				instructions.emplace_back(z80(z80::OpCode::ld, registers.ix, literal(translateLiteral(o1).value)));
				instructions.emplace_back(z80(z80::OpCode::add, registers.ix, registers.sp));
				instructions.emplace_back(z80(z80::OpCode::ld, registers.sp, registers.ix));
			}
			else {
				instructions.emplace_back(z80(z80::OpCode::add, translateValue(o2), translateLiteral(o1)));
			}
			break;
		case i386::OpCode::xorl:
			if (translateRegister(o2) != registers.a) {
				if (translateRegister(o2) == translateRegister(o1)) {
					// Clear the register
					instructions.emplace_back(z80(z80::OpCode::ld, translateRegister(o1),literal(0)));
				}
				else {
					log(LogLevel::Error, "Attempt to xor a register other than a!" + translateRegister(o2).value);
				}
			}
			else {
				instructions.emplace_back(z80(z80::OpCode::_xor, translateValue(o2), translateValue(o1)));
			}
			break;
		case i386::OpCode::movzwl:
			instructions.emplace_back(z80::OpCode::ld, registers.iy, translateLiteral(o1));
			break;
		case i386::OpCode::movw:
			instructions.emplace_back(z80::OpCode::ld, translateAddress(o2), translateValue(o1));
			break;
		case i386::OpCode::movl:
		case i386::OpCode::movb:
			if (o2 == literal("(%esp)")) {
				instructions.emplace_back(z80::OpCode::ld, registers.iyl, translateValue(o1));
				instructions.emplace_back(z80::OpCode::ld, registers.iyh, literal(0));
				instructions.emplace_back(z80::OpCode::ex, literal("(sp)"), registers.iy);
			}
			else {
				if (o1 != Operand(Operand::Type::reg, 0x10)) {
					instructions.emplace_back(z80(z80::OpCode::ld, registers.a, translateLiteral(o1)));
				}
				if (o2 != Operand(Operand::Type::reg, 0x10)) {
					instructions.emplace_back(z80(z80::OpCode::ld, translateAddress(o2), registers.a));
				}
			}
			break;
		case i386::OpCode::calll:
		case i386::OpCode::callw:
			instructions.emplace_back(z80(z80::OpCode::call, o1, o2));
			break;
		case i386::OpCode::ret:
		case i386::OpCode::retl:
			instructions.emplace_back(z80::OpCode::ret);
			break;
		case i386::OpCode::hlt:
			instructions.emplace_back(z80::OpCode::halt);
			break;
		default:
			instructions.emplace_back(z80::OpCode::unknown);
			break;
	}
}